

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

bool __thiscall draco::PointAttribute::Reset(PointAttribute *this,size_t num_attribute_values)

{
  unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *this_00;
  _Head_base<0UL,_draco::DataBuffer_*,_false> __ptr_00;
  bool bVar1;
  int32_t iVar2;
  DataBuffer *in_RAX;
  _Head_base<0UL,_draco::DataBuffer_*,_false> this_01;
  pointer *__ptr;
  pointer __p;
  long byte_stride;
  DataBuffer *local_28;
  
  local_28 = in_RAX;
  if ((this->attribute_buffer_)._M_t.
      super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
      super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl == (DataBuffer *)0x0) {
    this_01._M_head_impl = (DataBuffer *)operator_new(0x28);
    DataBuffer::DataBuffer(this_01._M_head_impl);
    this_00 = &this->attribute_buffer_;
    local_28 = (DataBuffer *)0x0;
    __ptr_00._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
         super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
         super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl = this_01._M_head_impl;
    if (__ptr_00._M_head_impl != (DataBuffer *)0x0) {
      std::default_delete<draco::DataBuffer>::operator()
                ((default_delete<draco::DataBuffer> *)this_00,__ptr_00._M_head_impl);
    }
    if (local_28 != (DataBuffer *)0x0) {
      std::default_delete<draco::DataBuffer>::operator()
                ((default_delete<draco::DataBuffer> *)&local_28,local_28);
    }
  }
  iVar2 = DataTypeLength((this->super_GeometryAttribute).data_type_);
  byte_stride = (long)iVar2 * (ulong)(this->super_GeometryAttribute).num_components_;
  bVar1 = DataBuffer::Update((this->attribute_buffer_)._M_t.
                             super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                             .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,
                             (void *)0x0,byte_stride * num_attribute_values);
  if (bVar1) {
    GeometryAttribute::ResetBuffer
              (&this->super_GeometryAttribute,
               (this->attribute_buffer_)._M_t.
               super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
               super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,byte_stride,0);
    this->num_unique_entries_ = (ValueType)num_attribute_values;
  }
  return bVar1;
}

Assistant:

bool PointAttribute::Reset(size_t num_attribute_values) {
  if (attribute_buffer_ == nullptr) {
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  }
  const int64_t entry_size = DataTypeLength(data_type()) * num_components();
  if (!attribute_buffer_->Update(nullptr, num_attribute_values * entry_size)) {
    return false;
  }
  // Assign the new buffer to the parent attribute.
  ResetBuffer(attribute_buffer_.get(), entry_size, 0);
  num_unique_entries_ = static_cast<uint32_t>(num_attribute_values);
  return true;
}